

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  color *origin;
  vec3 *pvVar1;
  double dVar2;
  double dVar3;
  double time;
  double local_128;
  ray local_118;
  vec3 local_e0;
  vec3 local_c8;
  undefined1 local_b0 [8];
  vec3 direction;
  bool cannot_refract;
  double sin_theta;
  double local_70;
  double cos_theta;
  vec3 unit_direction;
  double ri;
  double local_40;
  double local_38;
  ray *local_30;
  ray *scattered_local;
  color *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  dielectric *this_local;
  
  local_30 = scattered;
  scattered_local = (ray *)attenuation;
  attenuation_local = &rec->p;
  rec_local = (hit_record *)r_in;
  r_in_local = (ray *)this;
  vec3::vec3((vec3 *)&ri,1.0,1.0,1.0);
  (scattered_local->orig).e[0] = ri;
  (scattered_local->orig).e[1] = local_40;
  (scattered_local->orig).e[2] = local_38;
  if (((ulong)attenuation_local[3].e[2] & 1) == 0) {
    local_128 = this->refraction_index;
  }
  else {
    local_128 = 1.0 / this->refraction_index;
  }
  unit_direction.e[2] = local_128;
  pvVar1 = ray::direction((ray *)rec_local);
  unit_vector((vec3 *)&cos_theta,pvVar1);
  vec3::operator-((vec3 *)&sin_theta,(vec3 *)&cos_theta);
  local_70 = dot((vec3 *)&sin_theta,attenuation_local + 1);
  if (1.0 <= local_70) {
    local_70 = 1.0;
  }
  dVar2 = sqrt(-local_70 * local_70 + 1.0);
  direction.e[2]._7_1_ = 1.0 < unit_direction.e[2] * dVar2;
  vec3::vec3((vec3 *)local_b0);
  if ((direction.e[2]._7_1_ & 1) == 0) {
    dVar2 = reflectance(local_70,unit_direction.e[2]);
    dVar3 = random_double();
    if (dVar2 <= dVar3) {
      pvVar1 = (vec3 *)&cos_theta;
      refract(&local_e0,pvVar1,attenuation_local + 1,unit_direction.e[2]);
      local_b0 = (undefined1  [8])local_e0.e[0];
      direction.e[0] = local_e0.e[1];
      direction.e[1] = local_e0.e[2];
      goto LAB_001277e8;
    }
  }
  pvVar1 = (vec3 *)&cos_theta;
  reflect(&local_c8,pvVar1,attenuation_local + 1);
  local_b0 = (undefined1  [8])local_c8.e[0];
  direction.e[0] = local_c8.e[1];
  direction.e[1] = local_c8.e[2];
LAB_001277e8:
  origin = attenuation_local;
  ray::time((ray *)rec_local,(time_t *)pvVar1);
  ray::ray(&local_118,origin,(vec3 *)local_b0,time);
  memcpy(local_30,&local_118,0x38);
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        attenuation = color(1.0, 1.0, 1.0);
        double ri = rec.front_face ? (1.0/refraction_index) : refraction_index;

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = std::fmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = std::sqrt(1.0 - cos_theta*cos_theta);

        bool cannot_refract = ri * sin_theta > 1.0;
        vec3 direction;

        if (cannot_refract || reflectance(cos_theta, ri) > random_double())
            direction = reflect(unit_direction, rec.normal);
        else
            direction = refract(unit_direction, rec.normal, ri);

        scattered = ray(rec.p, direction, r_in.time());
        return true;
    }